

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# money.cpp
# Opt level: O0

ostream * operator<<(ostream *os,Money *m)

{
  ostream *poVar1;
  char *pcVar2;
  double local_70;
  string local_40;
  long local_20;
  long c;
  Money *m_local;
  ostream *os_local;
  
  c = (long)m;
  m_local = (Money *)os;
  local_20 = Money::get_cents(m);
  pcVar2 = "";
  if (local_20 < 0) {
    pcVar2 = "-";
  }
  poVar1 = std::operator<<((ostream *)m_local,pcVar2);
  Money::get_currency_abi_cxx11_(&local_40,(Money *)c);
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  if (local_20 < 0) {
    local_70 = (double)local_20 / -100.0;
  }
  else {
    local_70 = (double)local_20 / 100.0;
  }
  std::ostream::operator<<(poVar1,local_70);
  std::__cxx11::string::~string((string *)&local_40);
  return (ostream *)m_local;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Money& m)
{
	long c = m.get_cents();
	os << (c < 0 ? "-" : "")
		<< m.get_currency()
		<< (c < 0 ? c / (-100.0) : c / 100.0);
	return os;
}